

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O1

add_torrent_params * __thiscall
libtorrent::parse_magnet_uri
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,string_view uri,
          error_code *ec)

{
  string_view uri_00;
  storage_constructor_type local_48;
  
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_function_pointer =
       default_storage_constructor;
  local_48._M_invoker =
       std::
       _Function_handler<libtorrent::storage_interface_*(const_libtorrent::storage_params_&,_libtorrent::file_pool_&),_libtorrent::storage_interface_*(*)(const_libtorrent::storage_params_&,_libtorrent::file_pool_&)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<libtorrent::storage_interface_*(const_libtorrent::storage_params_&,_libtorrent::file_pool_&),_libtorrent::storage_interface_*(*)(const_libtorrent::storage_params_&,_libtorrent::file_pool_&)>
       ::_M_manager;
  add_torrent_params::add_torrent_params(__return_storage_ptr__,&local_48);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  uri_00.len_ = (size_t)uri.ptr_;
  uri_00.ptr_ = (char *)this;
  parse_magnet_uri(uri_00,__return_storage_ptr__,(error_code *)uri.len_);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params parse_magnet_uri(string_view uri, error_code& ec)
	{
		add_torrent_params ret;
		parse_magnet_uri(uri, ret, ec);
		return ret;
	}